

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsMeshValidate(FmsMesh mesh)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  long *in_RDI;
  FmsInt comp_id_1;
  FmsTag tag;
  FmsInt tag_id;
  FmsInt num_domains;
  FmsInt b_offset;
  FmsInt domain_name_id;
  FmsDomain domain_1;
  FmsInt part_id;
  FmsComponent comp;
  FmsInt comp_id;
  char **domain_names;
  FmsDomain domain;
  FmsInt domain_id;
  FmsInt name_end;
  FmsInt name_start;
  FmsInt name_id;
  ulong local_80;
  long local_68;
  ulong local_58;
  ulong local_48;
  ulong local_30;
  ulong local_18;
  int local_4;
  
  if (in_RDI == (long *)0x0) {
    local_4 = 1;
  }
  else if (*(long *)in_RDI[9] == 0) {
    if (*(long *)(in_RDI[9] + in_RDI[8] * 8) == *in_RDI) {
      if ((ulong)in_RDI[3] < (ulong)in_RDI[4]) {
        for (local_18 = 0; local_18 < (ulong)in_RDI[8]; local_18 = local_18 + 1) {
          uVar1 = *(ulong *)(in_RDI[9] + local_18 * 8);
          for (local_30 = uVar1; local_30 < *(ulong *)(in_RDI[9] + 8 + local_18 * 8);
              local_30 = local_30 + 1) {
            lVar2 = *(long *)(in_RDI[5] + local_30 * 8);
            if (*(long *)(lVar2 + 0x120) != *(long *)(in_RDI[10] + local_18 * 8)) {
              return 5;
            }
            if (uVar1 + *(long *)(lVar2 + 0x128) != local_30) {
              return 6;
            }
          }
        }
        lVar2 = in_RDI[10];
        for (local_48 = 0; local_48 < (ulong)in_RDI[1]; local_48 = local_48 + 1) {
          lVar3 = *(long *)(in_RDI[6] + local_48 * 8);
          if (*(ulong *)(lVar3 + 8) != local_48) {
            return 7;
          }
          if (*(long *)(lVar3 + 0x10) == 0x7f) {
            return 8;
          }
          for (local_58 = 0; local_58 < *(ulong *)(lVar3 + 0x20); local_58 = local_58 + 1) {
            lVar4 = *(long *)(*(long *)(lVar3 + 0x30) + local_58 * 0xe8);
            local_68 = 0;
            while( true ) {
              if (local_68 == in_RDI[8]) {
                return 9;
              }
              iVar6 = strcmp(*(char **)(lVar4 + 0x120),*(char **)(lVar2 + local_68 * 8));
              if (iVar6 == 0) break;
              local_68 = local_68 + 1;
            }
            lVar5 = *(long *)(in_RDI[9] + local_68 * 8);
            if ((ulong)(*(long *)(in_RDI[9] + 8 + local_68 * 8) - lVar5) <=
                *(ulong *)(lVar4 + 0x128)) {
              return 10;
            }
            if (*(long *)(in_RDI[5] + (lVar5 + *(long *)(lVar4 + 0x128)) * 8) != lVar4) {
              return 0xb;
            }
          }
        }
        for (local_80 = 0; local_80 < (ulong)in_RDI[2]; local_80 = local_80 + 1) {
          lVar2 = *(long *)(in_RDI[7] + local_80 * 8);
          uVar1 = *(ulong *)(*(long *)(lVar2 + 8) + 8);
          if ((ulong)in_RDI[1] <= uVar1) {
            return 0xc;
          }
          if (*(long *)(in_RDI[6] + uVar1 * 8) != *(long *)(lVar2 + 8)) {
            return 0xd;
          }
        }
        local_4 = 0;
      }
      else {
        local_4 = 4;
      }
    }
    else {
      local_4 = 3;
    }
  }
  else {
    local_4 = 2;
  }
  return local_4;
}

Assistant:

int FmsMeshValidate(FmsMesh mesh) {
  if (!mesh) { E_RETURN(1); }
  // Perform some validation
  if (mesh->domain_offsets[0] != 0) { E_RETURN(2); }
  if (mesh->domain_offsets[mesh->num_domain_names] != mesh->num_domains) {
    E_RETURN(3);
  }
  if (mesh->partition_id >= mesh->num_partitions) { E_RETURN(4); }
  // Check domains for consistency
  for (FmsInt name_id = 0; name_id < mesh->num_domain_names; name_id++) {
    const FmsInt name_start = mesh->domain_offsets[name_id];
    const FmsInt name_end = mesh->domain_offsets[name_id+1];
    for (FmsInt domain_id = name_start; domain_id < name_end; domain_id++) {
      FmsDomain domain = mesh->domains[domain_id];
      if (domain->name != mesh->domain_names[name_id]) { E_RETURN(5); }
      if (name_start + domain->id != domain_id) { E_RETURN(6); }
      // TODO: Check that all side ids are in the expected ranges
    }
  }
  // Check that all components use domains from the same mesh
  char **domain_names = mesh->domain_names;
  for (FmsInt comp_id = 0; comp_id < mesh->num_comps; comp_id++) {
    FmsComponent comp = mesh->comps[comp_id];
    if (comp->id != comp_id) { E_RETURN(7); }
    if (comp->dim == FMS_INVALID_DIM) { E_RETURN(8); }
    for (FmsInt part_id = 0; part_id < comp->num_parts; part_id++) {
      FmsDomain domain = comp->parts[part_id].domain;
      FmsInt domain_name_id = 0;
      for ( ; 1; domain_name_id++) {
        if (domain_name_id == mesh->num_domain_names) { E_RETURN(9); }
        if (strcmp(domain->name, domain_names[domain_name_id]) == 0) { break; }
      }
      FmsInt b_offset = mesh->domain_offsets[domain_name_id];
      FmsInt num_domains = mesh->domain_offsets[domain_name_id+1] - b_offset;
      if (domain->id >= num_domains) { E_RETURN(10); }
      if (mesh->domains[b_offset + domain->id] != domain) { E_RETURN(11); }
    }
  }
  // Check that all tags use components from the same mesh
  for (FmsInt tag_id = 0; tag_id < mesh->num_tags; tag_id++) {
    FmsTag tag = mesh->tags[tag_id];
    FmsInt comp_id = tag->comp->id;
    if (comp_id >= mesh->num_comps) { E_RETURN(12); }
    if (mesh->comps[comp_id] != tag->comp) { E_RETURN(13); }
  }
  return 0;
}